

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  float fVar1;
  uchar filterType;
  LodePNGColorType LVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined4 uVar5;
  uchar *puVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uchar *puVar18;
  LodePNGFilterStrategy LVar19;
  long lVar20;
  ulong uVar21;
  void **outsize;
  uchar *puVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  undefined1 auVar27 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar39;
  undefined1 in_XMM17 [16];
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  uchar *local_530;
  ulong local_520;
  uchar *local_4e0;
  void *local_4d8 [5];
  long local_4b0;
  undefined8 local_4a8;
  long local_4a0 [5];
  undefined1 local_478 [64];
  undefined1 local_438 [40];
  void *pvStack_410;
  ulong length;
  undefined1 auVar30 [32];
  
  LVar2 = info->colortype;
  iVar13 = 0;
  if ((ulong)LVar2 < 7) {
    iVar13 = *(int *)(&DAT_00a3d184 + (ulong)LVar2 * 4);
  }
  iVar13 = iVar13 * info->bitdepth;
  if (iVar13 == 0) {
    return 0x1f;
  }
  LVar19 = settings->filter_strategy;
  if (info->bitdepth < 8) {
    LVar19 = LFS_ZERO;
  }
  if (LVar2 == LCT_PALETTE) {
    LVar19 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar19 = settings->filter_strategy;
  }
  if (LFS_PREDEFINED < LVar19) {
    return 0x58;
  }
  uVar12 = w * iVar13 + 7;
  uVar24 = uVar12 >> 3;
  length = (ulong)uVar24;
  uVar17 = (ulong)(iVar13 + 7U >> 3);
  switch(LVar19) {
  case LFS_ZERO:
    if (h == 0) {
      return 0;
    }
    puVar18 = out + 1;
    uVar17 = 0;
    do {
      out[(length + 1) * uVar17] = '\0';
      if (7 < uVar12) {
        uVar16 = 0;
        do {
          puVar18[uVar16] = in[uVar16];
          uVar16 = uVar16 + 1;
        } while (length != uVar16);
      }
      uVar17 = uVar17 + 1;
      puVar18 = puVar18 + length + 1;
      in = in + length;
    } while (uVar17 != h);
    return 0;
  case LFS_MINSUM:
    local_4d8[0] = malloc(length);
    if (local_4d8[0] != (void *)0x0) {
      lVar14 = 1;
      do {
        lVar11 = lVar14;
        if (lVar11 == 5) {
          local_4b0 = lVar11;
          if (h != 0) {
            uVar23 = (ulong)(uVar24 - 1) + 8 & 0xfffffffffffffff8;
            auVar38 = vpbroadcastq_avx512f();
            local_478 = vmovdqu64_avx512f(auVar38);
            puVar18 = out + 1;
            uVar21 = 0;
            local_530 = (uchar *)0x0;
            local_520 = 0;
            uVar16 = 0;
            do {
              lVar14 = uVar21 * length;
              uVar15 = 0;
              do {
                puVar22 = (uchar *)local_4d8[uVar15];
                filterScanline(puVar22,in + lVar14,local_530,length,uVar17,(uchar)uVar15);
                *(undefined8 *)(local_438 + uVar15 * 8) = 0;
                if (uVar15 == 0) {
                  auVar38 = vmovdqu64_avx512f(local_478);
                  auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  if (7 < uVar12) {
                    auVar37 = ZEXT864((ulong)local_438._0_8_);
                    uVar9 = 0;
                    do {
                      auVar34 = vmovdqa64_avx512f(auVar37);
                      auVar37 = vpbroadcastq_avx512f();
                      auVar37 = vporq_avx512f(auVar37,auVar33);
                      uVar25 = vpcmpuq_avx512f(auVar37,auVar38,2);
                      auVar27 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar22 + uVar9));
                      auVar29[1] = ((byte)(uVar25 >> 1) & 1) * auVar27[1];
                      auVar29[0] = ((byte)uVar25 & 1) * auVar27[0];
                      auVar29[2] = ((byte)(uVar25 >> 2) & 1) * auVar27[2];
                      auVar29[3] = ((byte)(uVar25 >> 3) & 1) * auVar27[3];
                      auVar29[4] = ((byte)(uVar25 >> 4) & 1) * auVar27[4];
                      auVar29[5] = ((byte)(uVar25 >> 5) & 1) * auVar27[5];
                      auVar29[6] = ((byte)(uVar25 >> 6) & 1) * auVar27[6];
                      auVar29[7] = (char)(uVar25 >> 7) * auVar27[7];
                      auVar29._8_8_ = 0;
                      auVar37 = vpmovzxbq_avx512f(auVar29);
                      auVar37 = vpaddq_avx512f(auVar34,auVar37);
                      uVar9 = uVar9 + 8;
                    } while (uVar23 != uVar9);
                    goto LAB_004ebb54;
                  }
                }
                else {
                  auVar38 = vmovdqu64_avx512f(local_478);
                  auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar32._8_4_ = 0xff;
                  auVar32._0_8_ = 0xff000000ff;
                  auVar32._12_4_ = 0xff;
                  auVar32._16_4_ = 0xff;
                  auVar32._20_4_ = 0xff;
                  auVar32._24_4_ = 0xff;
                  auVar32._28_4_ = 0xff;
                  if (7 < uVar12) {
                    auVar37 = ZEXT864(*(ulong *)(local_438 + uVar15 * 8));
                    uVar9 = 0;
                    do {
                      auVar34 = vmovdqa64_avx512f(auVar37);
                      auVar37 = vpbroadcastq_avx512f();
                      auVar37 = vporq_avx512f(auVar37,auVar33);
                      uVar25 = vpcmpuq_avx512f(auVar37,auVar38,2);
                      auVar27 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar22 + uVar9));
                      auVar28[1] = ((byte)(uVar25 >> 1) & 1) * auVar27[1];
                      auVar28[0] = ((byte)uVar25 & 1) * auVar27[0];
                      auVar28[2] = ((byte)(uVar25 >> 2) & 1) * auVar27[2];
                      auVar28[3] = ((byte)(uVar25 >> 3) & 1) * auVar27[3];
                      auVar28[4] = ((byte)(uVar25 >> 4) & 1) * auVar27[4];
                      auVar28[5] = ((byte)(uVar25 >> 5) & 1) * auVar27[5];
                      auVar28[6] = ((byte)(uVar25 >> 6) & 1) * auVar27[6];
                      auVar28[7] = (char)(uVar25 >> 7) * auVar27[7];
                      auVar28._8_8_ = 0;
                      auVar4 = vpmovzxbd_avx2(auVar28);
                      uVar26 = vpmovb2m_avx512vl(auVar28);
                      auVar30 = vpxord_avx512vl(auVar4,auVar32);
                      bVar3 = (bool)((byte)uVar26 & 1);
                      auVar31._0_4_ = (uint)bVar3 * auVar30._0_4_ | (uint)!bVar3 * auVar4._0_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
                      auVar31._4_4_ = (uint)bVar3 * auVar30._4_4_ | (uint)!bVar3 * auVar4._4_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 2) & 1);
                      auVar31._8_4_ = (uint)bVar3 * auVar30._8_4_ | (uint)!bVar3 * auVar4._8_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 3) & 1);
                      auVar31._12_4_ = (uint)bVar3 * auVar30._12_4_ | (uint)!bVar3 * auVar4._12_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 4) & 1);
                      auVar31._16_4_ = (uint)bVar3 * auVar30._16_4_ | (uint)!bVar3 * auVar4._16_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 5) & 1);
                      auVar31._20_4_ = (uint)bVar3 * auVar30._20_4_ | (uint)!bVar3 * auVar4._20_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 6) & 1);
                      auVar31._24_4_ = (uint)bVar3 * auVar30._24_4_ | (uint)!bVar3 * auVar4._24_4_;
                      bVar3 = (bool)((byte)(uVar26 >> 7) & 1);
                      auVar31._28_4_ = (uint)bVar3 * auVar30._28_4_ | (uint)!bVar3 * auVar4._28_4_;
                      auVar37 = vpmovzxdq_avx512f(auVar31);
                      auVar37 = vpaddq_avx512f(auVar34,auVar37);
                      uVar9 = uVar9 + 8;
                    } while (uVar23 != uVar9);
LAB_004ebb54:
                    auVar38 = vmovdqa64_avx512f(auVar37);
                    bVar3 = (bool)((byte)uVar25 & 1);
                    auVar37._0_8_ = (ulong)bVar3 * auVar38._0_8_ | (ulong)!bVar3 * auVar34._0_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                    auVar37._8_8_ = (ulong)bVar3 * auVar38._8_8_ | (ulong)!bVar3 * auVar34._8_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                    auVar37._16_8_ = (ulong)bVar3 * auVar38._16_8_ | (ulong)!bVar3 * auVar34._16_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
                    auVar37._24_8_ = (ulong)bVar3 * auVar38._24_8_ | (ulong)!bVar3 * auVar34._24_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
                    auVar37._32_8_ = (ulong)bVar3 * auVar38._32_8_ | (ulong)!bVar3 * auVar34._32_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
                    auVar37._40_8_ = (ulong)bVar3 * auVar38._40_8_ | (ulong)!bVar3 * auVar34._40_8_;
                    bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
                    auVar37._48_8_ = (ulong)bVar3 * auVar38._48_8_ | (ulong)!bVar3 * auVar34._48_8_;
                    auVar37._56_8_ =
                         (uVar25 >> 7) * auVar38._56_8_ |
                         (ulong)!SUB81(uVar25 >> 7,0) * auVar34._56_8_;
                    auVar32 = vextracti64x4_avx512f(auVar37,1);
                    auVar38 = vpaddq_avx512f(auVar37,ZEXT3264(auVar32));
                    auVar27 = vpaddq_avx(auVar38._0_16_,auVar38._16_16_);
                    auVar29 = vpshufd_avx(auVar27,0xee);
                    auVar27 = vpaddq_avx(auVar27,auVar29);
                    *(long *)(local_438 + uVar15 * 8) = auVar27._0_8_;
                  }
                }
                if ((uVar15 == 0) || (*(ulong *)(local_438 + uVar15 * 8) < uVar16)) {
                  uVar16 = *(ulong *)(local_438 + uVar15 * 8);
                  local_520 = uVar15 & 0xffffffff;
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != 5);
              out[(length + 1) * uVar21] = (uchar)local_520;
              if (7 < uVar12) {
                pvVar7 = local_4d8[local_520 & 0xff];
                lVar11 = 0;
                do {
                  puVar18[lVar11] = *(uchar *)((long)pvVar7 + lVar11);
                  lVar11 = lVar11 + 1;
                } while (uVar24 != (uint)lVar11);
              }
              uVar21 = uVar21 + 1;
              puVar18 = puVar18 + length + 1;
              local_530 = in + lVar14;
            } while (uVar21 != h);
          }
          lVar11 = local_4b0;
          lVar14 = 0;
          do {
            free(local_4d8[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          break;
        }
        pvVar7 = malloc(length);
        local_4d8[lVar11] = pvVar7;
        lVar14 = lVar11 + 1;
      } while (pvVar7 != (void *)0x0);
LAB_004ebc23:
      if (lVar11 == 5) {
        return 0;
      }
      return 0x53;
    }
    break;
  case LFS_ENTROPY:
    local_4d8[0] = malloc(length);
    if (local_4d8[0] != (void *)0x0) {
      lVar14 = 1;
      do {
        lVar11 = lVar14;
        if (lVar11 == 5) {
          if (h != 0) {
            lVar14 = length + 1;
            puVar18 = out + 1;
            fVar1 = 0.0;
            uVar16 = 0;
            auVar33._60_4_ = 0;
            auVar33._0_60_ = local_478._4_60_;
            local_478 = auVar33 << 0x20;
            puVar22 = (uchar *)0x0;
            do {
              lVar10 = uVar16 * length;
              lVar20 = 0;
              do {
                puVar6 = (uchar *)local_4d8[lVar20];
                filterScanline(puVar6,in + lVar10,puVar22,length,uVar17,(uchar)lVar20);
                memset(local_438,0,0x400);
                if (7 < uVar12) {
                  lVar8 = 0;
                  do {
                    *(int *)(local_438 + (ulong)puVar6[lVar8] * 4) =
                         *(int *)(local_438 + (ulong)puVar6[lVar8] * 4) + 1;
                    lVar8 = lVar8 + 1;
                  } while (uVar24 != (uint)lVar8);
                }
                *(int *)(local_438 + lVar20 * 4) = *(int *)(local_438 + lVar20 * 4) + 1;
                *(undefined4 *)((long)local_4a0 + lVar20 * 4 + -8) = 0;
                fVar35 = 0.0;
                lVar8 = 0;
                do {
                  fVar36 = 0.0;
                  if (*(int *)(local_438 + lVar8 * 4) != 0) {
                    auVar27 = vcvtusi2ss_avx512f(in_XMM17,*(int *)(local_438 + lVar8 * 4));
                    fVar36 = auVar27._0_4_ / (float)lVar14;
                    auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
                    for (fVar39 = 1.0 / fVar36; 32.0 < fVar39; fVar39 = fVar39 * 0.0625) {
                      auVar38 = ZEXT464((uint)(auVar38._0_4_ + 4.0));
                    }
                    for (; 2.0 < fVar39; fVar39 = fVar39 * 0.5) {
                      auVar38 = ZEXT464((uint)(auVar38._0_4_ + 1.0));
                    }
                    auVar27 = vfmadd231ss_fma(ZEXT416((uint)((fVar39 * fVar39 * fVar39) / 3.0 +
                                                            fVar39 * fVar39 * 3.0 * -0.5)),
                                              SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar39));
                    auVar27 = vfmadd132ss_avx512f(ZEXT416((uint)(auVar27._0_4_ + -1.83333)),
                                                  auVar38._0_16_,ZEXT416(0x3fb8aa3b));
                    fVar36 = fVar36 * auVar27._0_4_;
                  }
                  fVar35 = fVar36 + fVar35;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x100);
                *(float *)((long)local_4a0 + lVar20 * 4 + -8) = fVar35;
                if ((lVar20 == 0) || (*(float *)((long)local_4a0 + lVar20 * 4 + -8) < fVar1)) {
                  fVar1 = *(float *)((long)local_4a0 + lVar20 * 4 + -8);
                  local_478._0_4_ = (int)lVar20;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 != 5);
              out[lVar14 * uVar16] = local_478[0];
              if (7 < uVar12) {
                pvVar7 = local_4d8[(uint)local_478._0_4_];
                lVar20 = 0;
                do {
                  puVar18[lVar20] = *(uchar *)((long)pvVar7 + lVar20);
                  lVar20 = lVar20 + 1;
                } while (uVar24 != (uint)lVar20);
              }
              uVar16 = uVar16 + 1;
              puVar18 = puVar18 + lVar14;
              puVar22 = in + lVar10;
            } while (uVar16 != h);
          }
          lVar14 = 0;
          do {
            free(local_4d8[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          break;
        }
        pvVar7 = malloc(length);
        local_4d8[lVar11] = pvVar7;
        lVar14 = lVar11 + 1;
      } while (pvVar7 != (void *)0x0);
      goto LAB_004ebc23;
    }
    break;
  case LFS_BRUTE_FORCE:
    uVar5 = (settings->zlibsettings).use_lz77;
    local_438._8_4_ = (settings->zlibsettings).windowsize;
    local_438._12_4_ = (settings->zlibsettings).minmatch;
    local_438._16_4_ = (settings->zlibsettings).nicematch;
    local_438._20_4_ = (settings->zlibsettings).lazymatching;
    pvStack_410 = (settings->zlibsettings).custom_context;
    local_438._4_4_ = uVar5;
    local_438._0_4_ = 1;
    local_438._24_16_ = (undefined1  [16])0x0;
    local_4a8 = malloc(length);
    if (local_4a8 != (void *)0x0) {
      lVar14 = 1;
      do {
        lVar11 = lVar14;
        if (lVar11 == 5) {
          if (h != 0) {
            puVar18 = out + 1;
            uVar16 = 0;
            auVar38._60_4_ = 0;
            auVar38._0_60_ = local_478._4_60_;
            local_478 = auVar38 << 0x20;
            pvVar7 = (void *)0x0;
            local_530 = (uchar *)0x0;
            do {
              lVar20 = uVar16 * length;
              outsize = local_4d8;
              lVar14 = 0;
              do {
                puVar22 = (uchar *)local_4a0[lVar14 + -1];
                filterScanline(puVar22,in + lVar20,local_530,length,uVar17,(uchar)lVar14);
                *outsize = (void *)0x0;
                local_4e0 = (uchar *)0x0;
                if ((_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                     *)local_438._24_8_ ==
                    (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                     *)0x0) {
                  lodepng_zlib_compress
                            (&local_4e0,(size_t *)outsize,puVar22,length,
                             (LodePNGCompressSettings *)local_438);
                }
                else {
                  (*(code *)local_438._24_8_)
                            (&local_4e0,(size_t *)outsize,puVar22,length,
                             (LodePNGCompressSettings *)local_438);
                }
                free(local_4e0);
                if ((lVar14 == 0) || (*outsize < pvVar7)) {
                  pvVar7 = *outsize;
                  local_478._0_4_ = (int)lVar14;
                }
                lVar14 = lVar14 + 1;
                outsize = outsize + 1;
              } while (lVar14 != 5);
              out[(length + 1) * uVar16] = local_478[0];
              if (7 < uVar12) {
                lVar14 = local_4a0[(ulong)(uint)local_478._0_4_ - 1];
                lVar10 = 0;
                do {
                  puVar18[lVar10] = *(uchar *)(lVar14 + lVar10);
                  lVar10 = lVar10 + 1;
                } while (uVar24 != (uint)lVar10);
              }
              uVar16 = uVar16 + 1;
              puVar18 = puVar18 + length + 1;
              local_530 = in + lVar20;
            } while (uVar16 != h);
          }
          lVar14 = 0;
          do {
            free((void *)local_4a0[lVar14 + -1]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          break;
        }
        pvVar7 = malloc(length);
        local_4a0[lVar11 + -1] = (long)pvVar7;
        lVar14 = lVar11 + 1;
      } while (pvVar7 != (void *)0x0);
      goto LAB_004ebc23;
    }
    break;
  case LFS_PREDEFINED:
    if (h != 0) {
      puVar22 = out + 1;
      uVar16 = 0;
      puVar18 = (uchar *)0x0;
      do {
        puVar6 = in;
        filterType = settings->predefined_filters[uVar16];
        puVar22[-1] = filterType;
        filterScanline(puVar22,puVar6,puVar18,length,uVar17,filterType);
        uVar16 = uVar16 + 1;
        puVar22 = puVar22 + length + 1;
        in = puVar6 + length;
        puVar18 = puVar6;
      } while (h != uVar16);
    }
    return 0;
  }
  return 0x53;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}